

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

void __thiscall
wasm::WATParser::ParseImplicitTypeDefsCtx::ParseImplicitTypeDefsCtx
          (ParseImplicitTypeDefsCtx *this,Lexer *in,
          vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types,
          unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
          *implicitTypes,IndexMap *typeIndices)

{
  pointer pHVar1;
  bool bVar2;
  RecGroup RVar3;
  size_t sVar4;
  pointer pHVar5;
  __hashtable *__h;
  optional<wasm::HeapType> oVar6;
  Signature local_58;
  uintptr_t local_48;
  Lexer *local_40;
  HeapType local_38;
  HeapType type;
  
  (this->super_TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>).typeIndices = typeIndices;
  local_40 = &this->in;
  Lexer::Lexer(local_40,in);
  this->types = types;
  this->implicitTypes = implicitTypes;
  (this->sigTypes)._M_h._M_buckets = &(this->sigTypes)._M_h._M_single_bucket;
  (this->sigTypes)._M_h._M_bucket_count = 1;
  (this->sigTypes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sigTypes)._M_h._M_element_count = 0;
  (this->sigTypes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->sigTypes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->sigTypes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pHVar1 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pHVar5 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl
                .super__Vector_impl_data._M_start; pHVar5 != pHVar1; pHVar5 = pHVar5 + 1) {
    local_38.id = pHVar5->id;
    bVar2 = HeapType::isSignature(&local_38);
    if (bVar2) {
      RVar3 = HeapType::getRecGroup(&local_38);
      local_58.params.id = RVar3.id;
      sVar4 = RecGroup::size((RecGroup *)&local_58);
      if (sVar4 == 1) {
        oVar6 = HeapType::getDeclaredSuperType(&local_38);
        if (((undefined1  [16])
             oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
            (undefined1  [16])0x0) {
          bVar2 = HeapType::isOpen(&local_38);
          if (!bVar2) {
            bVar2 = HeapType::isShared(&local_38);
            if (!bVar2) {
              local_58 = HeapType::getSignature(&local_38);
              local_48 = local_38.id;
              std::
              _Hashtable<wasm::Signature,std::pair<wasm::Signature_const,wasm::HeapType>,std::allocator<std::pair<wasm::Signature_const,wasm::HeapType>>,std::__detail::_Select1st,std::equal_to<wasm::Signature>,std::hash<wasm::Signature>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::_M_emplace<std::pair<wasm::Signature_const,wasm::HeapType>>
                        ((_Hashtable<wasm::Signature,std::pair<wasm::Signature_const,wasm::HeapType>,std::allocator<std::pair<wasm::Signature_const,wasm::HeapType>>,std::__detail::_Select1st,std::equal_to<wasm::Signature>,std::hash<wasm::Signature>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)&this->sigTypes,&local_58);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

ParseImplicitTypeDefsCtx(Lexer& in,
                           std::vector<HeapType>& types,
                           std::unordered_map<Index, HeapType>& implicitTypes,
                           const IndexMap& typeIndices)
    : TypeParserCtx<ParseImplicitTypeDefsCtx>(typeIndices), in(in),
      types(types), implicitTypes(implicitTypes) {
    for (auto type : types) {
      if (type.isSignature() && type.getRecGroup().size() == 1 &&
          !type.getDeclaredSuperType() && !type.isOpen() && !type.isShared()) {
        sigTypes.insert({type.getSignature(), type});
      }
    }
  }